

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_slay(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *in_RDI;
  char arg [4608];
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_000025b8;
  CHAR_DATA *in_stack_000025c0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  int in_stack_ffffffffffffede4;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
               (char *)in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
  }
  else {
    pCVar3 = get_char_room(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    if (pCVar3 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else if (in_RDI == pCVar3) {
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffedd8);
      if (!bVar1) {
        in_stack_ffffffffffffede4 = (int)pCVar3->level;
        iVar2 = get_trust(in_stack_ffffffffffffedd8);
        if (iVar2 <= in_stack_ffffffffffffede4) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
          return;
        }
      }
      act(in_stack_ffffffffffffedf0,
          (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
          (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
          in_stack_ffffffffffffedd8,0);
      act(in_stack_ffffffffffffedf0,
          (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
          (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
          in_stack_ffffffffffffedd8,0);
      act(in_stack_ffffffffffffedf0,
          (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
          (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
          in_stack_ffffffffffffedd8,0);
      raw_kill(in_stack_000025c0,in_stack_000025b8);
    }
  }
  return;
}

Assistant:

void do_slay(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];

	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Slay whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("Suicide is a mortal sin.\n\r", ch);
		return;
	}

	if (!is_npc(victim) && victim->level >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	act("You point at $M and $S heart stops!", ch, nullptr, victim, TO_CHAR);
	act("$n points at you and your heart suddenly stops!", ch, nullptr, victim, TO_VICT);
	act("$n points at $N and $E falls over clenching $s chest!", ch, nullptr, victim, TO_NOTVICT);

	raw_kill(ch, victim);
}